

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifpty(bifcxdef *ctx,int argc)

{
  objnum obj;
  runsdef *prVar1;
  runcxdef *prVar2;
  anon_union_8_4_1dda36f5_for_runsv aVar3;
  uint uVar4;
  uchar *puVar5;
  anon_union_8_4_1dda36f5_for_runsv aVar6;
  objnum orn;
  runsdef val;
  mcmon local_2a;
  runsdef local_28;
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp != '\x02') {
    prVar2->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3f2);
  }
  prVar1 = prVar2->runcxsp;
  obj = (prVar1->runsv).runsvobj;
  prVar2->runcxsp = prVar1 + -1;
  prVar2 = ctx->bifcxrun;
  if (prVar1[-1].runstyp == '\r') {
    uVar4 = objgetap(prVar2->runcxmem,obj,(prVar2->runcxsp->runsv).runsvprp,&local_2a,0);
    if (uVar4 == 0) {
      aVar3.runsvnum = 5;
    }
    else {
      puVar5 = mcmlck(ctx->bifcxrun->runcxmem,local_2a);
      aVar6.runsvnum._1_7_ = 0;
      aVar6.runsvnum._0_1_ = puVar5[(ulong)uVar4 + 2];
      local_28.runsv = aVar6;
      mcmunlck(ctx->bifcxrun->runcxmem,local_2a);
      aVar3.runsvnum = 7;
      if (aVar6.runsvnum != 0xe) {
        aVar3 = local_28.runsv;
      }
    }
    local_28.runsv = aVar3;
    runpush(ctx->bifcxrun,1,&local_28);
    return;
  }
  prVar2->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3f4);
}

Assistant:

void bifpty(bifcxdef *ctx, int argc)
{
    prpnum   prpn;
    objnum   objn;
    uint     ofs;
    runsdef  val;
    objnum   orn;
    objdef  *objptr;
    prpdef  *propptr;

    bifcntargs(ctx, 2, argc);
    
    /* get offset of obj.prop */
    objn = runpopobj(ctx->bifcxrun);
    prpn = runpopprp(ctx->bifcxrun);
    ofs = objgetap(ctx->bifcxrun->runcxmem, objn, prpn, &orn, FALSE);
    
    if (ofs)
    {
        /* lock the object, read the prpdef, and unlock it */
        objptr = (objdef *)mcmlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
        propptr = objofsp(objptr, ofs);
        val.runsv.runsvnum = prptype(propptr);
        mcmunlck(ctx->bifcxrun->runcxmem, (mcmon)orn);
    }
    else
    {
        /* property is not defined by object - indicate that type is nil */
        val.runsv.runsvnum = DAT_NIL;
    }
    
    /* special case:  DAT_DEMAND -> DAT_LIST (for contents properties) */
    if (val.runsv.runsvnum == DAT_DEMAND)
        val.runsv.runsvnum = DAT_LIST;

    /* return the property type as a number */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}